

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int properties_get_subject(PROPERTIES_HANDLE properties,char **subject_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar3 = 0x3f98;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(properties->composite_value,&item_count);
    iVar3 = 0x3fa0;
    if ((iVar1 == 0) && (iVar3 = 0x3fa6, 3 < item_count)) {
      value = amqpvalue_get_composite_item_in_place(properties->composite_value,3);
      iVar3 = 0x3fae;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_string(value,subject_value);
        iVar3 = 0x3fb5;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int properties_get_subject(PROPERTIES_HANDLE properties, const char** subject_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        if (amqpvalue_get_composite_item_count(properties_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 3)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(properties_instance->composite_value, 3);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_string(item_value, subject_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}